

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprMemoryLiteral *
CreateConstruct(ExpressionEvalContext *ctx,TypeBase *type,ExprBase *el0,ExprBase *el1,ExprBase *el2)

{
  bool bVar1;
  ExprPointerLiteral *ptr;
  uint local_54;
  uint offset;
  ExprMemoryLiteral *memory;
  ExprPointerLiteral *storage;
  longlong size;
  ExprBase *el2_local;
  ExprBase *el1_local;
  ExprBase *el0_local;
  TypeBase *type_local;
  ExpressionEvalContext *ctx_local;
  
  storage = (ExprPointerLiteral *)0x0;
  if (el0 != (ExprBase *)0x0) {
    storage = (ExprPointerLiteral *)el0->type->size;
  }
  if (el1 != (ExprBase *)0x0) {
    storage = (ExprPointerLiteral *)
              ((long)&(storage->super_ExprBase)._vptr_ExprBase + el1->type->size);
  }
  if (el2 != (ExprBase *)0x0) {
    storage = (ExprPointerLiteral *)
              ((long)&(storage->super_ExprBase)._vptr_ExprBase + el2->type->size);
  }
  if ((ExprPointerLiteral *)type->size != storage) {
    __assert_fail("type->size == size",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                  ,0x1bd,
                  "ExprMemoryLiteral *CreateConstruct(ExpressionEvalContext &, TypeBase *, ExprBase *, ExprBase *, ExprBase *)"
                 );
  }
  ptr = AllocateTypeStorage(ctx,el0->source,type);
  if (ptr == (ExprPointerLiteral *)0x0) {
    ctx_local = (ExpressionEvalContext *)0x0;
  }
  else {
    ctx_local = (ExpressionEvalContext *)ExpressionContext::get<ExprMemoryLiteral>(ctx->ctx);
    ExprMemoryLiteral::ExprMemoryLiteral((ExprMemoryLiteral *)ctx_local,el0->source,type,ptr);
    local_54 = 0;
    if ((el0 == (ExprBase *)0x0) ||
       (bVar1 = CreateInsert(ctx,(ExprMemoryLiteral *)ctx_local,0,el0), bVar1)) {
      if (el0 != (ExprBase *)0x0) {
        local_54 = (uint)el0->type->size;
      }
      if ((el1 == (ExprBase *)0x0) ||
         (bVar1 = CreateInsert(ctx,(ExprMemoryLiteral *)ctx_local,local_54,el1), bVar1)) {
        if (el1 != (ExprBase *)0x0) {
          local_54 = (int)el1->type->size + local_54;
        }
        if ((el2 != (ExprBase *)0x0) &&
           (bVar1 = CreateInsert(ctx,(ExprMemoryLiteral *)ctx_local,local_54,el2), !bVar1)) {
          ctx_local = (ExpressionEvalContext *)0x0;
        }
      }
      else {
        ctx_local = (ExpressionEvalContext *)0x0;
      }
    }
    else {
      ctx_local = (ExpressionEvalContext *)0x0;
    }
  }
  return (ExprMemoryLiteral *)ctx_local;
}

Assistant:

ExprMemoryLiteral* CreateConstruct(ExpressionEvalContext &ctx, TypeBase *type, ExprBase *el0, ExprBase *el1, ExprBase *el2)
{
	long long size = 0;
	
	if(el0)
		size += el0->type->size;

	if(el1)
		size += el1->type->size;

	if(el2)
		size += el2->type->size;

	assert(type->size == size);

	ExprPointerLiteral *storage = AllocateTypeStorage(ctx, el0->source, type);

	if(!storage)
		return NULL;

	ExprMemoryLiteral *memory = new (ctx.ctx.get<ExprMemoryLiteral>()) ExprMemoryLiteral(el0->source, type, storage);

	unsigned offset = 0;

	if(el0 && !CreateInsert(ctx, memory, offset, el0))
		return NULL;
	else if(el0)
		offset += unsigned(el0->type->size);

	if(el1 && !CreateInsert(ctx, memory, offset, el1))
		return NULL;
	else if(el1)
		offset += unsigned(el1->type->size);

	if(el2 && !CreateInsert(ctx, memory, offset, el2))
		return NULL;
	else if(el2)
		offset += unsigned(el2->type->size);

	return memory;
}